

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall
sznet::Logger::Logger(Logger *this,SourceFile file,int line,LogLevel level,char *func)

{
  self *this_00;
  char *func_local;
  LogLevel level_local;
  int line_local;
  Logger *this_local;
  SourceFile file_local;
  
  this_local = (Logger *)file.m_data;
  file_local.m_data._0_4_ = file.m_size;
  Impl::Impl(&this->m_impl,level,0,(SourceFile *)&this_local,line);
  this_00 = LogStream::operator<<(&(this->m_impl).m_stream,func);
  LogStream::operator<<(this_00,' ');
  return;
}

Assistant:

Logger::Logger(SourceFile file, int line, LogLevel level, const char* func): 
	m_impl(level, 0, file, line)
{
	m_impl.m_stream << func << ' ';
}